

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave.cpp
# Opt level: O2

void __thiscall
Wave::Wave(Wave *this,uint height,uint width,
          vector<double,_std::allocator<double>_> *patterns_frequencies)

{
  pointer pdVar1;
  size_t width_00;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  vector<double,_std::allocator<double>_> *plogp;
  double dVar5;
  double dVar6;
  value_type_conflict2 local_80;
  allocator_type local_79;
  double local_78;
  double local_70;
  _Vector_base<double,_std::allocator<double>_> local_68;
  double base_s;
  double base_entropy;
  double entropy_base;
  double log_base_s;
  ulong height_00;
  
  local_78 = (double)CONCAT44(local_78._4_4_,width);
  std::vector<double,_std::allocator<double>_>::vector
            (&this->patterns_frequencies,patterns_frequencies);
  (this->plogp_patterns_frequencies).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->plogp_patterns_frequencies).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->plogp_patterns_frequencies).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar3 = 0;
  while( true ) {
    pdVar1 = (patterns_frequencies->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(patterns_frequencies->super__Vector_base<double,_std::allocator<double>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)pdVar1 >> 3) <= (ulong)uVar3
       ) break;
    local_70 = pdVar1[uVar3];
    dVar5 = log(local_70);
    local_68._M_impl.super__Vector_impl_data._M_start = (pointer)(dVar5 * local_70);
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (&this->plogp_patterns_frequencies,(double *)&local_68);
    uVar3 = uVar3 + 1;
  }
  pdVar1 = (this->plogp_patterns_frequencies).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  dVar5 = INFINITY;
  for (uVar3 = 0;
      (ulong)uVar3 <
      (ulong)((long)(this->plogp_patterns_frequencies).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pdVar1 >> 3); uVar3 = uVar3 + 1) {
    dVar6 = ABS(pdVar1[uVar3] * 0.5);
    if (dVar5 <= dVar6) {
      dVar6 = dVar5;
    }
    dVar5 = dVar6;
  }
  this->min_abs_half_plogp = dVar5;
  (this->memoisation).plogp_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->memoisation).plogp_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->memoisation).plogp_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->memoisation).sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->memoisation).sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->memoisation).sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->memoisation).log_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->memoisation).log_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->memoisation).log_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->memoisation).nb_patterns.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->memoisation).nb_patterns.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->memoisation).nb_patterns.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->memoisation).entropy.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->memoisation).entropy.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->memoisation).entropy.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->memoisation).entropy.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  width_00 = (long)(patterns_frequencies->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(patterns_frequencies->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 3;
  this->nb_patterns = width_00;
  uVar3 = local_78._0_4_;
  uVar4 = local_78._0_4_ * height;
  height_00 = (ulong)uVar4;
  Array2D<unsigned_char>::Array2D(&this->data,height_00,width_00,'\x01');
  this->width = uVar3;
  this->height = height;
  this->size = uVar4;
  base_entropy = 0.0;
  base_s = 0.0;
  for (uVar3 = 0; uVar2 = (ulong)uVar3, uVar2 < this->nb_patterns; uVar3 = uVar3 + 1) {
    base_entropy = base_entropy +
                   (this->plogp_patterns_frequencies).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar2];
    base_s = base_s + (patterns_frequencies->super__Vector_base<double,_std::allocator<double>_>).
                      _M_impl.super__Vector_impl_data._M_start[uVar2];
  }
  local_78 = base_entropy;
  local_70 = base_s;
  log_base_s = log(base_s);
  entropy_base = log_base_s - local_78 / local_70;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_68,height_00,&base_entropy,
             (allocator_type *)&local_80);
  std::vector<double,_std::allocator<double>_>::_M_move_assign
            (&(this->memoisation).plogp_sum,&local_68);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_68);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_68,height_00,&base_s,
             (allocator_type *)&local_80);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&(this->memoisation).sum,&local_68);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_68);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_68,height_00,&log_base_s,
             (allocator_type *)&local_80);
  std::vector<double,_std::allocator<double>_>::_M_move_assign
            (&(this->memoisation).log_sum,&local_68);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_68);
  local_80 = (value_type_conflict2)this->nb_patterns;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_68,height_00,&local_80,
             &local_79);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&(this->memoisation).nb_patterns,&local_68);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_68);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_68,height_00,&entropy_base,
             (allocator_type *)&local_80);
  std::vector<double,_std::allocator<double>_>::_M_move_assign
            (&(this->memoisation).entropy,&local_68);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_68);
  return;
}

Assistant:

Wave::Wave(unsigned height, unsigned width,
     const std::vector<double> &patterns_frequencies) noexcept
  : patterns_frequencies(patterns_frequencies),
    plogp_patterns_frequencies(get_plogp(patterns_frequencies)),
    min_abs_half_plogp(get_min_abs_half(plogp_patterns_frequencies)),
    is_impossible(false), nb_patterns(patterns_frequencies.size()),
    data(width * height, nb_patterns, 1), width(width), height(height),
    size(height * width) {
  // Initialize the memoisation of entropy.
  double base_entropy = 0;
  double base_s = 0;
  for (unsigned i = 0; i < nb_patterns; i++) {
    base_entropy += plogp_patterns_frequencies[i];
    base_s += patterns_frequencies[i];
  }
  double log_base_s = log(base_s);
  double entropy_base = log_base_s - base_entropy / base_s;
  memoisation.plogp_sum = std::vector<double>(width * height, base_entropy);
  memoisation.sum = std::vector<double>(width * height, base_s);
  memoisation.log_sum = std::vector<double>(width * height, log_base_s);
  memoisation.nb_patterns =
    std::vector<unsigned>(width * height, static_cast<unsigned>(nb_patterns));
  memoisation.entropy = std::vector<double>(width * height, entropy_base);
}